

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

token * abstract_array_static_declarator(dmr_C *C,token *token,int *has_static)

{
  for (; *(position *)((long)token + 0x10) == (position)C->S->static_ident;
      token = *(token **)((long)token + 8)) {
    if (*has_static != 0) {
      dmrC_sparse_error(C,token->pos,"duplicate array static declarator");
    }
    *has_static = 1;
  }
  return (token *)(position)token;
}

Assistant:

static struct token *abstract_array_static_declarator(struct dmr_C *C, struct token *token, int *has_static)
{
	while (token->ident == C->S->static_ident) {
		if (*has_static)
			dmrC_sparse_error(C, token->pos, "duplicate array static declarator");

		*has_static = 1;
		token = token->next;
	}
	return token;

}